

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.h
# Opt level: O0

Index * __thiscall Cache<Index>::find(Cache<Index> *this,function<bool_(const_Index_&)> *func)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  anon_class_8_1_898bcfc2_for__M_pred in_RSI;
  __normal_iterator<Cache<Index>::Entry_*,_std::vector<Cache<Index>::Entry,_std::allocator<Cache<Index>::Entry>_>_>
  item;
  vector<Cache<Index>::Entry,_std::allocator<Cache<Index>::Entry>_> *in_stack_ffffffffffffffa8;
  __normal_iterator<Cache<Index>::Entry_*,_std::vector<Cache<Index>::Entry,_std::allocator<Cache<Index>::Entry>_>_>
  local_20 [3];
  pointer local_8;
  
  __first = std::vector<Cache<Index>::Entry,_std::allocator<Cache<Index>::Entry>_>::begin
                      (in_stack_ffffffffffffffa8);
  __last = std::vector<Cache<Index>::Entry,_std::allocator<Cache<Index>::Entry>_>::end
                     (in_stack_ffffffffffffffa8);
  local_20[0] = std::
                find_if<__gnu_cxx::__normal_iterator<Cache<Index>::Entry*,std::vector<Cache<Index>::Entry,std::allocator<Cache<Index>::Entry>>>,Cache<Index>::find(std::function<bool(Index_const&)>)::_lambda(Cache<Index>::Entry_const&)_1_>
                          (__first._M_current,__last._M_current,in_RSI);
  std::vector<Cache<Index>::Entry,_std::allocator<Cache<Index>::Entry>_>::end
            (in_stack_ffffffffffffffa8);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<Cache<Index>::Entry_*,_std::vector<Cache<Index>::Entry,_std::allocator<Cache<Index>::Entry>_>_>
                      *)in_RSI.func,
                     (__normal_iterator<Cache<Index>::Entry_*,_std::vector<Cache<Index>::Entry,_std::allocator<Cache<Index>::Entry>_>_>
                      *)in_stack_ffffffffffffffa8);
  if (bVar1) {
    local_8 = __gnu_cxx::
              __normal_iterator<Cache<Index>::Entry_*,_std::vector<Cache<Index>::Entry,_std::allocator<Cache<Index>::Entry>_>_>
              ::operator->(local_20);
  }
  else {
    local_8 = (pointer)0x0;
  }
  return &local_8->data;
}

Assistant:

T* find(std::function<bool(const T& t)> func) {
			auto item = std::find_if(entries.begin(), entries.end(), [&](const Entry& entry) {
				return func(entry.data);
			});

			if (item != entries.end()) {
				return &item->data;
			}
			return nullptr;
		}